

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QLocale::Country>::emplace<QLocale::Country&>
          (QPodArrayOps<QLocale::Country> *this,qsizetype i,Country *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  Country *pCVar3;
  Country *in_RDX;
  QArrayDataPointer<QLocale::Country> *in_RSI;
  QArrayDataPointer<QLocale::Country> *in_RDI;
  Country *where;
  GrowthPosition pos;
  Country tmp;
  bool detach;
  QArrayDataPointer<QLocale::Country> *in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  Country CVar5;
  undefined1 in_stack_ffffffffffffffe6;
  
  uVar1 = QArrayDataPointer<QLocale::Country>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QLocale::Country> *)in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QLocale::Country>::freeSpaceAtEnd(in_stack_ffffffffffffffd8),
       qVar2 != 0)) {
      pCVar3 = QArrayDataPointer<QLocale::Country>::end(in_RDI);
      *pCVar3 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<QLocale::Country> *)0x0) &&
       (qVar2 = QArrayDataPointer<QLocale::Country>::freeSpaceAtBegin(in_stack_ffffffffffffffd8),
       qVar2 != 0)) {
      pCVar3 = QArrayDataPointer<QLocale::Country>::begin
                         ((QArrayDataPointer<QLocale::Country> *)0x4f8b07);
      pCVar3[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  CVar5 = *in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QLocale::Country> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QLocale::Country>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffe6,CONCAT24(CVar5,uVar4))),
             (Country **)in_stack_ffffffffffffffd8,in_RDI);
  pCVar3 = createHole((QPodArrayOps<QLocale::Country> *)in_RSI,
                      (GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffe6,CONCAT24(CVar5,uVar4))),
                      (qsizetype)in_stack_ffffffffffffffd8);
  *pCVar3 = CVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }